

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TIntermediate::addBinaryMath
          (TIntermediate *this,TOperator op,TIntermTyped *left,TIntermTyped *right,TSourceLoc *loc)

{
  TType *pTVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar6;
  TIntermTyped *pTVar7;
  TIntermediate *pTVar8;
  long *plVar9;
  long lVar10;
  ulong uVar11;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TIntermConstantUnion *right_00;
  TIntermediate *this_00;
  tuple<glslang::TIntermTyped_*,_glslang::TIntermTyped_*> children;
  TIntermTyped *local_e8;
  TIntermTyped *local_e0;
  TIntermConstantUnion *local_d8;
  TIntermConstantUnion *local_d0;
  TIntermTyped *local_c8;
  _Alloc_hider local_c0;
  
  local_e8 = left;
  local_e0 = right;
  iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
  iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar4));
  if (iVar4 != 0x10) {
    iVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
    iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x38))
                      ((long *)CONCAT44(extraout_var_00,iVar4));
    if (iVar4 == 0x10) {
      return (TIntermTyped *)0x0;
    }
    if (op - EOpAdd < 2) {
      pTVar1 = &left->type;
      iVar4 = (*(left->type)._vptr_TType[7])(pTVar1);
      if (iVar4 == 0x12) {
        iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
        plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0xa8))
                                   ((long *)CONCAT44(extraout_var_01,iVar4));
        cVar2 = (**(code **)(*plVar5 + 0x1a8))(plVar5);
        if (cVar2 != '\0') {
          return (TIntermTyped *)0x0;
        }
      }
      iVar4 = (*(right->type)._vptr_TType[7])(&right->type);
      if (iVar4 == 0x12) {
        iVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
        plVar5 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0xa8))
                                   ((long *)CONCAT44(extraout_var_02,iVar4));
        cVar2 = (**(code **)(*plVar5 + 0x1a8))(plVar5);
        if (cVar2 != '\0') {
          return (TIntermTyped *)0x0;
        }
      }
      iVar4 = (*pTVar1->_vptr_TType[7])(pTVar1);
      if ((iVar4 == 0x12) &&
         ((iVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x20])(right),
          (iVar4 - 4U & 0xfffffff9) == 0 || ((iVar4 - 5U & 0xfffffff9) == 0)))) {
        iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
        local_d8 = (TIntermConstantUnion *)CONCAT44(extraout_var_04,iVar4);
        iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
        iVar4 = computeBufferReferenceTypeSize((TType *)CONCAT44(extraout_var_05,iVar4));
        local_d0 = addConstantUnion(this,(long)iVar4,loc,true);
        TType::TType((TType *)&stack0xffffffffffffff38,EbtUint64,EvqTemporary,1,0,0,false);
        pTVar7 = addBuiltInFunctionCall
                           (this,loc,EOpConvPtrToUint64,true,&left->super_TIntermNode,
                            (TType *)&stack0xffffffffffffff38);
        local_e8 = pTVar7;
        local_e0 = createConversion(this,EbtInt64,right);
        pTVar6 = addBinaryMath(this,EOpMul,local_e0,&local_d0->super_TIntermTyped,loc);
        local_e0 = pTVar6;
        goto LAB_00410840;
      }
    }
    if (op == EOpSub) {
      iVar4 = (*(left->type)._vptr_TType[7])(&left->type);
      if ((iVar4 == 0x12) && (iVar4 = (*(right->type)._vptr_TType[7])(&right->type), iVar4 == 0x12))
      {
        iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])(left);
        iVar4 = computeBufferReferenceTypeSize((TType *)CONCAT44(extraout_var_03,iVar4));
        local_d8 = addConstantUnion(this,(long)iVar4,loc,true);
        TType::TType((TType *)&stack0xffffffffffffff38,EbtUint64,EvqTemporary,1,0,0,false);
        pTVar6 = addBuiltInFunctionCall
                           (this,loc,EOpConvPtrToUint64,true,&left->super_TIntermNode,
                            (TType *)&stack0xffffffffffffff38);
        local_e8 = pTVar6;
        TType::TType((TType *)&stack0xffffffffffffff38,EbtUint64,EvqTemporary,1,0,0,false);
        pTVar7 = addBuiltInFunctionCall
                           (this,loc,EOpConvPtrToUint64,true,&right->super_TIntermNode,
                            (TType *)&stack0xffffffffffffff38);
        local_e0 = pTVar7;
        TType::TType((TType *)&stack0xffffffffffffff38,EbtInt64,EvqTemporary,1,0,0,false);
        pTVar6 = addBuiltInFunctionCall
                           (this,loc,EOpConvNumeric,true,&pTVar6->super_TIntermNode,
                            (TType *)&stack0xffffffffffffff38);
        local_e8 = pTVar6;
        TType::TType((TType *)&stack0xffffffffffffff38,EbtInt64,EvqTemporary,1,0,0,false);
        local_e0 = addBuiltInFunctionCall
                             (this,loc,EOpConvNumeric,true,&pTVar7->super_TIntermNode,
                              (TType *)&stack0xffffffffffffff38);
        local_e8 = addBinaryMath(this,EOpSub,pTVar6,local_e0,loc);
        pTVar6 = addBinaryMath(this,EOpDiv,local_e8,&local_d8->super_TIntermTyped,loc);
        return pTVar6;
      }
    }
    else if (((op == EOpAdd) &&
             (iVar4 = (*(right->type)._vptr_TType[7])(&right->type), iVar4 == 0x12)) &&
            ((iVar4 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x20])(left),
             (iVar4 - 4U & 0xfffffff9) == 0 || ((iVar4 - 5U & 0xfffffff9) == 0)))) {
      iVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
      local_d8 = (TIntermConstantUnion *)CONCAT44(extraout_var_06,iVar4);
      iVar4 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])(right);
      iVar4 = computeBufferReferenceTypeSize((TType *)CONCAT44(extraout_var_07,iVar4));
      right_00 = addConstantUnion(this,(long)iVar4,loc,true);
      TType::TType((TType *)&stack0xffffffffffffff38,EbtUint64,EvqTemporary,1,0,0,false);
      pTVar6 = addBuiltInFunctionCall
                         (this,loc,EOpConvPtrToUint64,true,&right->super_TIntermNode,
                          (TType *)&stack0xffffffffffffff38);
      local_e0 = pTVar6;
      local_e8 = createConversion(this,EbtInt64,left);
      pTVar7 = addBinaryMath(this,EOpMul,local_e8,&right_00->super_TIntermTyped,loc);
      op = EOpAdd;
      local_e8 = pTVar7;
LAB_00410840:
      pTVar6 = addBinaryMath(this,op,pTVar7,pTVar6,loc);
      pTVar6 = addBuiltInFunctionCall
                         (this,loc,EOpConvUint64ToPtr,true,&pTVar6->super_TIntermNode,
                          (TType *)local_d8);
      return pTVar6;
    }
    iVar4 = (*(left->type)._vptr_TType[7])(&left->type);
    if ((iVar4 != 0x12) && (iVar4 = (*(right->type)._vptr_TType[7])(&right->type), iVar4 != 0x12)) {
      addPairConversion((TIntermediate *)&stack0xffffffffffffff38,(TOperator)this,
                        (TIntermTyped *)(ulong)op,left);
      local_e8 = (TIntermTyped *)local_c0._M_p;
      local_e0 = local_c8;
      if ((local_c8 != (TIntermTyped *)0x0 && (TIntermTyped *)local_c0._M_p != (TIntermTyped *)0x0)
         && (pTVar8 = this, addBiShapeConversion(this,op,&local_e8,&local_e0),
            local_e0 != (TIntermTyped *)0x0 && local_e8 != (TIntermTyped *)0x0)) {
        pTVar8 = (TIntermediate *)addBinaryNode(pTVar8,op,local_e8,local_e0,loc);
        bVar3 = promote(this,(TIntermOperator *)pTVar8);
        if (bVar3) {
          (**(code **)(*(long *)pTVar8 + 0x1a0))(pTVar8);
          plVar5 = (long *)(**(code **)(*(long *)pTVar8 + 400))(pTVar8);
          plVar5 = (long *)(**(code **)(*plVar5 + 0x28))(plVar5);
          plVar9 = (long *)(**(code **)(*(long *)pTVar8 + 0x198))(pTVar8);
          lVar10 = (**(code **)(*plVar9 + 0x28))(plVar9);
          if (((plVar5 != (long *)0x0) && (lVar10 != 0)) &&
             (pTVar6 = (TIntermTyped *)
                       (**(code **)(*plVar5 + 0x180))
                                 (plVar5,(pTVar8->resources).value.maxLights,lVar10),
             pTVar6 != (TIntermTyped *)0x0)) {
            return pTVar6;
          }
          pTVar6 = (TIntermTyped *)(**(code **)(*(long *)pTVar8 + 400))(pTVar8);
          this_00 = pTVar8;
          pTVar7 = (TIntermTyped *)(**(code **)(*(long *)pTVar8 + 0x198))();
          bVar3 = specConstantPropagates(this_00,pTVar6,pTVar7);
          if ((bVar3) &&
             (bVar3 = isSpecializationOperation(this_00,(TIntermOperator *)pTVar8), bVar3)) {
            plVar5 = (long *)(**(code **)(*(long *)pTVar8 + 0xf8))(pTVar8);
            lVar10 = (**(code **)(*plVar5 + 0x50))(plVar5);
            *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) & 0xfffffffeffffff80 | 0x100000002;
          }
          plVar5 = (long *)(**(code **)(*(long *)pTVar8 + 400))(pTVar8);
          lVar10 = (**(code **)(*plVar5 + 0x108))(plVar5);
          if ((*(byte *)(lVar10 + 0xc) & 2) == 0) {
            plVar5 = (long *)(**(code **)(*(long *)pTVar8 + 0x198))(pTVar8);
            lVar10 = (**(code **)(*plVar5 + 0x108))(plVar5);
            if ((*(ulong *)(lVar10 + 8) & 0x200000000) == 0) {
              return (TIntermTyped *)pTVar8;
            }
          }
          uVar11 = (ulong)(uint)(pTVar8->resources).value.maxLights;
          if (uVar11 < 0x37) {
            if ((0x7ff79ffe00ff00U >> (uVar11 & 0x3f) & 1) != 0) {
              plVar5 = (long *)(**(code **)(*(long *)pTVar8 + 0xf8))(pTVar8);
              lVar10 = (**(code **)(*plVar5 + 0x50))(plVar5);
              *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) | 0x200000000;
              return (TIntermTyped *)pTVar8;
            }
            return (TIntermTyped *)pTVar8;
          }
          return (TIntermTyped *)pTVar8;
        }
      }
    }
  }
  return (TIntermTyped *)0x0;
}

Assistant:

TIntermTyped* TIntermediate::addBinaryMath(TOperator op, TIntermTyped* left, TIntermTyped* right, const TSourceLoc& loc)
{
    // No operations work on blocks
    if (left->getType().getBasicType() == EbtBlock || right->getType().getBasicType() == EbtBlock)
        return nullptr;

    // Convert "reference +/- int" and "reference - reference" to integer math
    if (op == EOpAdd || op == EOpSub) {

        // No addressing math on struct with unsized array.
        if ((left->isReference() && left->getType().getReferentType()->containsUnsizedArray()) ||
            (right->isReference() && right->getType().getReferentType()->containsUnsizedArray())) {
            return nullptr;
        }

        if (left->isReference() && isTypeInt(right->getBasicType())) {
            const TType& referenceType = left->getType();
            TIntermConstantUnion* size = addConstantUnion((unsigned long long)computeBufferReferenceTypeSize(left->getType()), loc, true);
            left  = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, left, TType(EbtUint64));

            right = createConversion(EbtInt64, right);
            right = addBinaryMath(EOpMul, right, size, loc);

            TIntermTyped *node = addBinaryMath(op, left, right, loc);
            node = addBuiltInFunctionCall(loc, EOpConvUint64ToPtr, true, node, referenceType);
            return node;
        }
    }

    if (op == EOpAdd && right->isReference() && isTypeInt(left->getBasicType())) {
        const TType& referenceType = right->getType();
        TIntermConstantUnion* size =
            addConstantUnion((unsigned long long)computeBufferReferenceTypeSize(right->getType()), loc, true);
        right = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, right, TType(EbtUint64));

        left  = createConversion(EbtInt64, left);
        left  = addBinaryMath(EOpMul, left, size, loc);

        TIntermTyped *node = addBinaryMath(op, left, right, loc);
        node = addBuiltInFunctionCall(loc, EOpConvUint64ToPtr, true, node, referenceType);
        return node;
    }

    if (op == EOpSub && left->isReference() && right->isReference()) {
        TIntermConstantUnion* size =
            addConstantUnion((long long)computeBufferReferenceTypeSize(left->getType()), loc, true);

        left = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, left, TType(EbtUint64));
        right = addBuiltInFunctionCall(loc, EOpConvPtrToUint64, true, right, TType(EbtUint64));

        left = addBuiltInFunctionCall(loc, EOpConvNumeric, true, left, TType(EbtInt64));
        right = addBuiltInFunctionCall(loc, EOpConvNumeric, true, right, TType(EbtInt64));

        left = addBinaryMath(EOpSub, left, right, loc);

        TIntermTyped *node = addBinaryMath(EOpDiv, left, size, loc);
        return node;
    }

    // No other math operators supported on references
    if (left->isReference() || right->isReference())
        return nullptr;

    // Try converting the children's base types to compatible types.
    auto children = addPairConversion(op, left, right);
    left = std::get<0>(children);
    right = std::get<1>(children);

    if (left == nullptr || right == nullptr)
        return nullptr;

    // Convert the children's type shape to be compatible.
    addBiShapeConversion(op, left, right);
    if (left == nullptr || right == nullptr)
        return nullptr;

    //
    // Need a new node holding things together.  Make
    // one and promote it to the right type.
    //
    TIntermBinary* node = addBinaryNode(op, left, right, loc);
    if (! promote(node))
        return nullptr;

    node->updatePrecision();

    //
    // If they are both (non-specialization) constants, they must be folded.
    // (Unless it's the sequence (comma) operator, but that's handled in addComma().)
    //
    TIntermConstantUnion *leftTempConstant = node->getLeft()->getAsConstantUnion();
    TIntermConstantUnion *rightTempConstant = node->getRight()->getAsConstantUnion();
    if (leftTempConstant && rightTempConstant) {
        TIntermTyped* folded = leftTempConstant->fold(node->getOp(), rightTempConstant);
        if (folded)
            return folded;
    }

    // If can propagate spec-constantness and if the operation is an allowed
    // specialization-constant operation, make a spec-constant.
    if (specConstantPropagates(*node->getLeft(), *node->getRight()) && isSpecializationOperation(*node))
        node->getWritableType().getQualifier().makeSpecConstant();

    // If must propagate nonuniform, make a nonuniform.
    if ((node->getLeft()->getQualifier().isNonUniform() || node->getRight()->getQualifier().isNonUniform()) &&
            isNonuniformPropagating(node->getOp()))
        node->getWritableType().getQualifier().nonUniform = true;

    return node;
}